

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_option.c
# Opt level: O0

light_option light_get_option(light_pcapng pcapng,uint16_t option_code)

{
  light_option iterator;
  uint16_t option_code_local;
  light_pcapng pcapng_local;
  light_option local_8;
  
  if (pcapng == (light_pcapng)0x0) {
    local_8 = (light_option)0x0;
  }
  else {
    for (iterator = pcapng->options;
        (iterator != (light_option)0x0 && (iterator->custom_option_code != option_code));
        iterator = iterator->next_option) {
    }
    local_8 = iterator;
  }
  return local_8;
}

Assistant:

light_option light_get_option(const light_pcapng pcapng, uint16_t option_code)
{
	if (pcapng == NULL) {
		return NULL;
	}

	light_option iterator = pcapng->options;

	while (iterator != NULL) {
		if (iterator->custom_option_code == option_code) {
			break;
		}
		iterator = iterator->next_option;
	}

	return iterator;
}